

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

Fad<double> *
TPZMatrix<Fad<double>_>::ReturnNearestValue
          (Fad<double> *__return_storage_ptr__,Fad<double> *val,TPZVec<Fad<double>_> *Vec,
          Fad<double> *tol)

{
  Vector<double> *this;
  uint uVar1;
  Fad<double> *pFVar2;
  uint uVar3;
  undefined4 uVar4;
  MEM_CPY<double> *pMVar5;
  TPZVec<Fad<double>_> *pTVar6;
  long lVar7;
  Vector<double> *a;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  int sz;
  Fad<double> *pFVar11;
  Fad<double> *pFVar12;
  Fad<double> diff0;
  Fad<double> exps;
  Fad<double> diff1;
  undefined1 local_118 [24];
  double dStack_100;
  Fad<double> *local_f8;
  undefined8 uStack_f0;
  TPZVec<Fad<double>_> *local_e8;
  Fad<double> *local_e0;
  undefined1 local_d8 [24];
  double local_c0;
  Fad<double> local_b8;
  Fad<double> *local_98;
  undefined8 uStack_90;
  Vector<double> *local_88;
  Fad<double> local_80;
  Fad<double> local_60;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_40;
  
  pFVar11 = Vec->fStore;
  local_118._0_8_ = pFVar11->val_;
  uVar1 = (pFVar11->dx_).num_elts;
  local_118._16_8_ = (MEM_CPY<double> *)0x0;
  local_118._8_4_ = uVar1;
  local_e8 = Vec;
  local_e0 = tol;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 << 3;
    }
    local_118._16_8_ = operator_new__(uVar9);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_118._16_8_,(EVP_PKEY_CTX *)(pFVar11->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  uVar4 = local_118._8_4_;
  dStack_100 = pFVar11->defaultVal;
  local_b8.val_ = val->val_ - (double)local_118._0_8_;
  uVar1 = (val->dx_).num_elts;
  uVar3 = local_118._8_4_;
  if ((int)local_118._8_4_ < (int)uVar1) {
    uVar3 = uVar1;
  }
  local_b8.dx_.num_elts = 0;
  local_b8.dx_.ptr_to_data = (double *)0x0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
    local_b8.dx_.num_elts = uVar3;
    local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar9 * 8);
    local_b8.defaultVal = 0.0;
    if (0 < (int)uVar3) {
      lVar7 = 0;
      do {
        pdVar8 = (double *)((long)(val->dx_).ptr_to_data + lVar7);
        if (uVar1 == 0) {
          pdVar8 = &val->defaultVal;
        }
        pMVar5 = (MEM_CPY<double> *)(local_118._16_8_ + lVar7);
        if (uVar4 == 0) {
          pMVar5 = (MEM_CPY<double> *)&dStack_100;
        }
        *(double *)((long)local_b8.dx_.ptr_to_data + lVar7) = *pdVar8 - *(double *)pMVar5;
        lVar7 = lVar7 + 8;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  local_b8.defaultVal = 0.0;
  Fad<double>::~Fad((Fad<double> *)local_118);
  pFVar11 = (Fad<double> *)ABS(local_b8.val_);
  pFVar12 = (Fad<double> *)ABS(local_e0->val_);
  if ((double)pFVar11 < (double)pFVar12) {
    local_118._0_8_ = 10000000000.0;
    local_118._8_4_ = 0;
    local_118._16_8_ = (double *)0x0;
  }
  else {
    pFVar2 = local_e8->fStore;
    local_d8._0_8_ = pFVar2->val_;
    uVar1 = (pFVar2->dx_).num_elts;
    local_d8._16_8_ = (MEM_CPY<double> *)0x0;
    uStack_90 = 0;
    uStack_f0 = 0;
    local_f8 = pFVar12;
    local_d8._8_4_ = uVar1;
    local_98 = pFVar11;
    if ((long)(int)uVar1 != 0) {
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar9 = (long)(int)uVar1 * 8;
      }
      local_d8._16_8_ = operator_new__(uVar9);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_d8._16_8_,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data,
                 (EVP_PKEY_CTX *)(ulong)uVar1);
    }
    uVar4 = local_d8._8_4_;
    local_c0 = pFVar2->defaultVal;
    local_118._0_8_ = val->val_ - (double)local_d8._0_8_;
    uVar1 = (val->dx_).num_elts;
    uVar3 = local_d8._8_4_;
    if ((int)local_d8._8_4_ < (int)uVar1) {
      uVar3 = uVar1;
    }
    local_118._8_4_ = 0;
    local_118._16_8_ = (double *)0x0;
    pFVar11 = local_98;
    pFVar12 = local_f8;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
      local_118._8_4_ = uVar3;
      local_118._16_8_ = operator_new__(uVar9 * 8);
      dStack_100 = 0.0;
      pFVar11 = local_98;
      pFVar12 = local_f8;
      if (0 < (int)uVar3) {
        lVar7 = 0;
        do {
          pdVar8 = (double *)((long)(val->dx_).ptr_to_data + lVar7);
          if (uVar1 == 0) {
            pdVar8 = &val->defaultVal;
          }
          pMVar5 = (MEM_CPY<double> *)(local_d8._16_8_ + lVar7);
          if (uVar4 == 0) {
            pMVar5 = (MEM_CPY<double> *)&local_c0;
          }
          *(double *)(local_118._16_8_ + lVar7) = *pdVar8 - *(double *)pMVar5;
          lVar7 = lVar7 + 8;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
  }
  dStack_100 = 0.0;
  if ((double)pFVar12 <= (double)pFVar11) {
    Fad<double>::~Fad((Fad<double> *)local_d8);
  }
  Fad<double>::Fad(&local_60);
  pTVar6 = local_e8;
  pFVar11 = local_e8->fStore;
  __return_storage_ptr__->val_ = pFVar11->val_;
  uVar1 = (pFVar11->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = uVar1;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 * 8;
    }
    pMVar5 = (MEM_CPY<double> *)operator_new__(uVar9);
    (__return_storage_ptr__->dx_).ptr_to_data = (double *)pMVar5;
    MEM_CPY<double>::copy
              (pMVar5,(EVP_PKEY_CTX *)(pFVar11->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  __return_storage_ptr__->defaultVal = pFVar11->defaultVal;
  local_f8 = __return_storage_ptr__;
  local_98 = val;
  if (1 < pTVar6->fNElements) {
    this = (Vector<double> *)(local_118 + 8);
    local_88 = &__return_storage_ptr__->dx_;
    lVar10 = 1;
    lVar7 = 0x38;
    do {
      pFVar11 = pTVar6->fStore;
      local_80.val_ = *(double *)((long)pFVar11 + lVar7 + -0x18);
      uVar1 = *(uint *)((long)pFVar11 + lVar7 + -0x10);
      local_80.dx_.ptr_to_data = (double *)0x0;
      local_80.dx_.num_elts = uVar1;
      if ((long)(int)uVar1 != 0) {
        uVar9 = (long)(int)uVar1 * 8;
        if ((int)uVar1 < 0) {
          uVar9 = 0xffffffffffffffff;
        }
        local_80.dx_.ptr_to_data = (double *)operator_new__(uVar9);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_80.dx_.ptr_to_data,
                   *(EVP_PKEY_CTX **)((long)pFVar11 + lVar7 + -8),(EVP_PKEY_CTX *)(ulong)uVar1);
      }
      local_80.defaultVal = *(double *)((long)&pFVar11->val_ + lVar7);
      local_40.fadexpr_.left_ = local_98;
      local_40.fadexpr_.right_ = &local_80;
      Fad<double>::operator=(&local_60,&local_40);
      Fad<double>::~Fad(&local_80);
      pTVar6 = local_e8;
      a = this;
      pFVar11 = (Fad<double> *)local_118;
      if ((ABS(local_e0->val_) <= ABS(local_60.val_)) &&
         (pFVar11 = (Fad<double> *)local_118, ABS(local_60.val_) < ABS((double)local_118._0_8_))) {
        pFVar11 = local_e8->fStore;
        local_f8->val_ = *(double *)((long)pFVar11 + lVar7 + -0x18);
        Vector<double>::operator=(local_88,(Vector<double> *)((long)pFVar11 + lVar7 + -0x10));
        local_f8->defaultVal = *(double *)((long)&pFVar11->val_ + lVar7);
        a = &local_60.dx_;
        pFVar11 = &local_60;
      }
      local_118._0_8_ = pFVar11->val_;
      Vector<double>::operator=(this,a);
      dStack_100 = pFVar11->defaultVal;
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar10 < pTVar6->fNElements);
  }
  Fad<double>::~Fad(&local_60);
  Fad<double>::~Fad((Fad<double> *)local_118);
  Fad<double>::~Fad(&local_b8);
  return local_f8;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}